

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssw.c
# Opt level: O3

__m128i * qP_word(int8_t *read_num,int8_t *mat,int32_t readLen,int32_t n)

{
  __m128i *palVar1;
  ulong uVar2;
  short sVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  __m128i *palVar8;
  ulong uVar9;
  __m128i *palVar10;
  
  uVar4 = (long)(readLen + 7) / 8;
  iVar5 = (int)uVar4;
  uVar4 = uVar4 & 0xffffffff;
  palVar1 = (__m128i *)malloc((long)(iVar5 * n) << 4);
  if (0 < n) {
    uVar2 = 1;
    if (1 < iVar5) {
      uVar2 = uVar4;
    }
    iVar5 = 0;
    palVar10 = palVar1;
    do {
      if (0 < readLen) {
        uVar6 = 0;
        do {
          palVar8 = palVar10;
          lVar7 = 0;
          uVar9 = uVar6;
          do {
            if ((int)uVar9 < readLen) {
              sVar3 = (short)mat[(long)read_num[uVar9] + (long)(iVar5 * n)];
            }
            else {
              sVar3 = 0;
            }
            *(short *)((long)*palVar8 + lVar7) = sVar3;
            uVar9 = uVar9 + uVar4;
            lVar7 = lVar7 + 2;
          } while ((int)lVar7 != 0x10);
          uVar6 = uVar6 + 1;
          palVar10 = (__m128i *)((long)*palVar8 + lVar7);
        } while (uVar6 != uVar2);
        palVar10 = (__m128i *)((long)*palVar8 + lVar7);
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 != n);
  }
  return palVar1;
}

Assistant:

static __m128i* qP_word (const int8_t* read_num,
				  const int8_t* mat,
				  const int32_t readLen,
				  const int32_t n) {

	int32_t segLen = (readLen + 7) / 8;
	__m128i* vProfile = (__m128i*)malloc(n * segLen * sizeof(__m128i));
	int16_t* t = (int16_t*)vProfile;
	int32_t nt, i, j;
	int32_t segNum;

	/* Generate query profile rearrange query sequence & calculate the weight of match/mismatch */
	for (nt = 0; LIKELY(nt < n); nt ++) {
		for (i = 0; i < segLen; i ++) {
			j = i;
			for (segNum = 0; LIKELY(segNum < 8) ; segNum ++) {
				*t++ = j>= readLen ? 0 : mat[nt * n + read_num[j]];
				j += segLen;
			}
		}
	}
	return vProfile;
}